

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O0

DdNode * cuddBddXorExistAbstractRecur(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DdManager *pDVar4;
  uint *puVar5;
  uint *puVar6;
  DdManager *pDVar7;
  DdNode *pDVar8;
  uint local_b4;
  DdNode *tmp;
  uint index;
  uint top;
  uint topcube;
  uint topg;
  uint topf;
  DdNode *Cube;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *zero;
  DdNode *one;
  DdNode *gnv;
  DdNode *gv;
  DdNode *G;
  DdNode *fnv;
  DdNode *fv;
  DdNode *F;
  DdNode *cube_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  pDVar7 = (DdManager *)manager->one;
  pDVar4 = (DdManager *)((ulong)pDVar7 ^ 1);
  manager_local = pDVar4;
  if ((f != g) && (manager_local = pDVar7, f != (DdNode *)((ulong)g ^ 1))) {
    if ((DdManager *)cube == pDVar7) {
      manager_local = (DdManager *)cuddBddXorRecur(manager,f,g);
    }
    else if ((DdManager *)f == pDVar7) {
      manager_local = (DdManager *)cuddBddExistAbstractRecur(manager,(DdNode *)((ulong)g ^ 1),cube);
    }
    else if ((DdManager *)g == pDVar7) {
      manager_local = (DdManager *)cuddBddExistAbstractRecur(manager,(DdNode *)((ulong)f ^ 1),cube);
    }
    else if ((DdManager *)f == pDVar4) {
      manager_local = (DdManager *)cuddBddExistAbstractRecur(manager,g,cube);
    }
    else if ((DdManager *)g == pDVar4) {
      manager_local = (DdManager *)cuddBddExistAbstractRecur(manager,f,cube);
    }
    else {
      cube_local = g;
      g_local = f;
      if ((*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)g & 1)) <
          (*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)f & 1))) {
        cube_local = f;
        g_local = g;
      }
      manager_local = (DdManager *)cuddCacheLookup(manager,10,g_local,cube_local,cube);
      if (manager_local == (DdManager *)0x0) {
        puVar5 = (uint *)((ulong)g_local & 0xfffffffffffffffe);
        uVar1 = manager->perm[*puVar5];
        puVar6 = (uint *)((ulong)cube_local & 0xfffffffffffffffe);
        uVar2 = manager->perm[*puVar6];
        local_b4 = uVar1;
        if (uVar2 < uVar1) {
          local_b4 = uVar2;
        }
        uVar3 = manager->perm[cube->index];
        if (uVar3 < local_b4) {
          manager_local =
               (DdManager *)
               cuddBddXorExistAbstractRecur(manager,g_local,cube_local,(cube->type).kids.T);
        }
        else {
          if (uVar1 == local_b4) {
            tmp._4_4_ = *puVar5;
            fnv = *(DdNode **)(puVar5 + 4);
            G = *(DdNode **)(puVar5 + 6);
            if (((ulong)g_local & 1) != 0) {
              fnv = (DdNode *)((ulong)fnv ^ 1);
              G = (DdNode *)((ulong)G ^ 1);
            }
          }
          else {
            tmp._4_4_ = *puVar6;
            G = g_local;
            fnv = g_local;
          }
          if (uVar2 == local_b4) {
            gnv = *(DdNode **)(puVar6 + 4);
            one = *(DdNode **)(puVar6 + 6);
            if (((ulong)cube_local & 1) != 0) {
              gnv = (DdNode *)((ulong)gnv ^ 1);
              one = (DdNode *)((ulong)one ^ 1);
            }
          }
          else {
            one = cube_local;
            gnv = cube_local;
          }
          _topg = cube;
          if (uVar3 == local_b4) {
            _topg = (cube->type).kids.T;
          }
          pDVar4 = (DdManager *)cuddBddXorExistAbstractRecur(manager,fnv,gnv,_topg);
          if (pDVar4 == (DdManager *)0x0) {
            manager_local = (DdManager *)0x0;
          }
          else if ((pDVar4 == pDVar7) && (uVar3 == local_b4)) {
            cuddCacheInsert(manager,10,g_local,cube_local,cube,(DdNode *)pDVar7);
            manager_local = pDVar7;
          }
          else {
            *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + 1;
            pDVar7 = (DdManager *)cuddBddXorExistAbstractRecur(manager,G,one,_topg);
            if (pDVar7 == (DdManager *)0x0) {
              Cudd_IterDerefBdd(manager,(DdNode *)pDVar4);
              manager_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4) + 1;
              if (uVar3 == local_b4) {
                pDVar8 = cuddBddAndRecur(manager,(DdNode *)((ulong)pDVar4 ^ 1),
                                         (DdNode *)((ulong)pDVar7 ^ 1));
                if (pDVar8 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(manager,(DdNode *)pDVar4);
                  Cudd_IterDerefBdd(manager,(DdNode *)pDVar7);
                  return (DdNode *)0x0;
                }
                t = (DdNode *)((ulong)pDVar8 ^ 1);
                *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) + 1;
                Cudd_IterDerefBdd(manager,(DdNode *)pDVar4);
                Cudd_IterDerefBdd(manager,(DdNode *)pDVar7);
                *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)t & 0xfffffffffffffffe) + 4) + -1;
              }
              else if (pDVar4 == pDVar7) {
                *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + -1;
                *(int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4) + -1;
                t = (DdNode *)pDVar4;
              }
              else {
                if (((ulong)pDVar4 & 1) == 0) {
                  t = cuddUniqueInter(manager,tmp._4_4_,(DdNode *)pDVar4,(DdNode *)pDVar7);
                  if (t == (DdNode *)0x0) {
                    Cudd_IterDerefBdd(manager,(DdNode *)pDVar4);
                    Cudd_IterDerefBdd(manager,(DdNode *)pDVar7);
                    return (DdNode *)0x0;
                  }
                }
                else {
                  pDVar8 = cuddUniqueInter(manager,tmp._4_4_,(DdNode *)((ulong)pDVar4 ^ 1),
                                           (DdNode *)((ulong)pDVar7 ^ 1));
                  if (pDVar8 == (DdNode *)0x0) {
                    Cudd_IterDerefBdd(manager,(DdNode *)pDVar4);
                    Cudd_IterDerefBdd(manager,(DdNode *)pDVar7);
                    return (DdNode *)0x0;
                  }
                  t = (DdNode *)((ulong)pDVar8 ^ 1);
                }
                *(int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4) + -1;
                *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4) + -1;
              }
              cuddCacheInsert(manager,10,g_local,cube_local,cube,t);
              manager_local = (DdManager *)t;
            }
          }
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
cuddBddXorExistAbstractRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *F, *fv, *fnv, *G, *gv, *gnv;
    DdNode *one, *zero, *r, *t, *e, *Cube;
    unsigned int topf, topg, topcube, top, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == g) {
        return(zero);
    }
    if (f == Cudd_Not(g)) {
        return(one);
    }
    if (cube == one) {
        return(cuddBddXorRecur(manager, f, g));
    }
    if (f == one) {
        return(cuddBddExistAbstractRecur(manager, Cudd_Not(g), cube));
    }
    if (g == one) {
        return(cuddBddExistAbstractRecur(manager, Cudd_Not(f), cube));
    }
    if (f == zero) {
        return(cuddBddExistAbstractRecur(manager, g, cube));
    }
    if (g == zero) {
        return(cuddBddExistAbstractRecur(manager, f, cube));
    }

    /* At this point f, g, and cube are not constant. */

    if (cuddF2L(f) > cuddF2L(g)) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }

    /* Check cache. */
    r = cuddCacheLookup(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube);
    if (r != NULL) {
        return(r);
    }

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    F = Cudd_Regular(f);
    topf = manager->perm[F->index];
    G = Cudd_Regular(g);
    topg = manager->perm[G->index];
    top = ddMin(topf, topg);
    topcube = manager->perm[cube->index];

    if (topcube < top) {
        return(cuddBddXorExistAbstractRecur(manager, f, g, cuddT(cube)));
    }
    /* Now, topcube >= top. */

    if (topf == top) {
        index = F->index;
        fv = cuddT(F);
        fnv = cuddE(F);
        if (Cudd_IsComplement(f)) {
            fv = Cudd_Not(fv);
            fnv = Cudd_Not(fnv);
        }
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg == top) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    if (topcube == top) {
        Cube = cuddT(cube);
    } else {
        Cube = cube;
    }

    t = cuddBddXorExistAbstractRecur(manager, fv, gv, Cube);
    if (t == NULL) return(NULL);

    /* Special case: 1 OR anything = 1. Hence, no need to compute
    ** the else branch if t is 1.
    */
    if (t == one && topcube == top) {
        cuddCacheInsert(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube, one);
        return(one);
    }
    cuddRef(t);

    e = cuddBddXorExistAbstractRecur(manager, fnv, gnv, Cube);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (topcube == top) {       /* abstract */
        r = cuddBddAndRecur(manager, Cudd_Not(t), Cudd_Not(e));
        if (r == NULL) {
            Cudd_IterDerefBdd(manager, t);
            Cudd_IterDerefBdd(manager, e);
            return(NULL);
        }
        r = Cudd_Not(r);
        cuddRef(r);
        Cudd_IterDerefBdd(manager, t);
        Cudd_IterDerefBdd(manager, e);
        cuddDeref(r);
    } else if (t == e) {
        r = t;
        cuddDeref(t);
        cuddDeref(e);
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
        cuddDeref(e);
        cuddDeref(t);
    }
    cuddCacheInsert(manager, DD_BDD_XOR_EXIST_ABSTRACT_TAG, f, g, cube, r);
    return (r);

}